

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_v7tar.c
# Opt level: O3

int archive_write_v7tar_header(archive_write *a,archive_entry *entry)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  size_t sVar6;
  undefined4 *puVar7;
  undefined8 *puVar8;
  undefined1 uVar9;
  mode_t mVar10;
  wchar_t wVar11;
  archive_string_conv *sc;
  char *pcVar12;
  size_t sVar13;
  archive_string *paVar14;
  int *piVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  undefined4 *puVar20;
  la_int64_t lVar21;
  undefined8 *puVar22;
  uint uVar23;
  int iVar24;
  undefined1 uVar25;
  la_int64_t *plVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  size_t copy_length;
  char *p;
  char buff [512];
  size_t local_258;
  la_int64_t *local_250;
  char *local_248;
  char *local_240;
  archive_string local_238 [4];
  byte abStack_1cf [9];
  undefined1 auStack_1c6 [6];
  undefined2 local_1c0;
  undefined1 auStack_1be [9];
  undefined4 uStack_1b5;
  undefined8 uStack_1b1;
  undefined4 uStack_1a9;
  undefined1 auStack_1a5 [9];
  undefined1 local_19c;
  undefined1 auStack_19b [363];
  
  plVar26 = (la_int64_t *)a->format_data;
  sc = (archive_string_conv *)plVar26[2];
  if (sc == (archive_string_conv *)0x0) {
    if ((int)plVar26[4] == 0) {
      sc = archive_string_default_conversion_for_write(&a->archive);
      plVar26[3] = (la_int64_t)sc;
      *(undefined4 *)(plVar26 + 4) = 1;
    }
    else {
      sc = (archive_string_conv *)plVar26[3];
    }
  }
  pcVar12 = archive_entry_pathname(entry);
  if (pcVar12 == (char *)0x0) {
    pcVar12 = "Can\'t record entry in tar file without pathname";
    iVar24 = -1;
    goto LAB_004cde4f;
  }
  pcVar12 = archive_entry_hardlink(entry);
  if (((pcVar12 != (char *)0x0) || (pcVar12 = archive_entry_symlink(entry), pcVar12 != (char *)0x0))
     || (mVar10 = archive_entry_filetype(entry), mVar10 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar10 = archive_entry_filetype(entry);
  if (((mVar10 == 0x4000) && (pcVar12 = archive_entry_pathname(entry), pcVar12 != (char *)0x0)) &&
     (sVar13 = strlen(pcVar12), pcVar12[sVar13 - 1] != '/')) {
    local_238[0].s = (char *)0x0;
    local_238[0].length = 0;
    local_238[0].buffer_length = 0;
    local_250 = plVar26;
    sVar13 = strlen(pcVar12);
    paVar14 = archive_string_ensure(local_238,sVar13 + 2);
    if (paVar14 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate v7tar data");
      archive_string_free(local_238);
      return -0x1e;
    }
    local_238[0].length = 0;
    archive_strncat(local_238,pcVar12,sVar13);
    archive_strappend_char(local_238,'/');
    archive_entry_copy_pathname(entry,local_238[0].s);
    archive_string_free(local_238);
    plVar26 = local_250;
  }
  memcpy(local_238,"",0x200);
  wVar11 = _archive_entry_pathname_l(entry,&local_240,&local_258,sc);
  if (wVar11 == L'\0') {
    iVar24 = 0;
    local_250 = plVar26;
  }
  else {
    piVar15 = __errno_location();
    pcVar12 = local_240;
    if (*piVar15 == 0xc) {
      pcVar12 = "Can\'t allocate memory for Pathname";
      goto LAB_004cdf5d;
    }
    local_250 = plVar26;
    pcVar16 = archive_string_conversion_charset_name(sc);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar12,pcVar16);
    iVar24 = -0x14;
  }
  if (local_258 < 100) {
    memcpy(local_238,local_240,local_258);
  }
  else {
    archive_set_error(&a->archive,0x24,"Pathname too long");
    iVar24 = -0x19;
  }
  wVar11 = _archive_entry_hardlink_l(entry,&local_248,&local_258,sc);
  if (wVar11 != L'\0') {
    piVar15 = __errno_location();
    pcVar12 = local_248;
    if (*piVar15 != 0xc) {
      pcVar16 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar12,pcVar16);
      iVar24 = -0x14;
      goto LAB_004cdf21;
    }
LAB_004cdf56:
    pcVar12 = "Can\'t allocate memory for Linkname";
LAB_004cdf5d:
    archive_set_error(&a->archive,0xc,pcVar12);
    return -0x1e;
  }
LAB_004cdf21:
  sVar6 = local_258;
  uVar9 = 0x31;
  if (local_258 == 0) {
    wVar11 = _archive_entry_symlink_l(entry,&local_248,&local_258,sc);
    if (wVar11 != L'\0') {
      piVar15 = __errno_location();
      pcVar12 = local_248;
      if (*piVar15 == 0xc) goto LAB_004cdf56;
      pcVar16 = archive_string_conversion_charset_name(sc);
      archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar12,pcVar16);
      iVar24 = -0x14;
    }
    uVar25 = 0xff;
    uVar9 = 0xff;
    if (local_258 != 0) goto LAB_004cdfd2;
  }
  else {
LAB_004cdfd2:
    uVar25 = uVar9;
    if (99 < local_258) {
      archive_set_error(&a->archive,0x24,"Link contents too long");
      local_258 = 100;
      iVar24 = -0x19;
    }
    memcpy(auStack_19b,local_248,local_258);
  }
  mVar10 = archive_entry_mode(entry);
  uVar23 = 7;
  uVar17 = (ulong)(mVar10 & 0xfff);
  puVar7 = (undefined4 *)((long)abStack_1cf + 1);
  do {
    puVar20 = puVar7;
    uVar18 = uVar17;
    *(byte *)((long)puVar20 + -1) = (byte)uVar18 & 7 | 0x30;
    uVar23 = uVar23 - 1;
    uVar17 = uVar18 >> 3;
    puVar7 = (undefined4 *)((long)puVar20 + -1);
  } while (1 < uVar23);
  if (7 < uVar18) {
    *(undefined2 *)((long)puVar20 + 3) = 0x3737;
    *(undefined4 *)((long)puVar20 + -1) = 0x37373737;
    archive_set_error(&a->archive,0x22,"Numeric mode too large");
    iVar24 = -0x19;
  }
  uVar17 = archive_entry_uid(entry);
  if ((long)uVar17 < 0) {
    abStack_1cf[7] = 0x30;
    abStack_1cf[8] = 0x30;
    abStack_1cf[3] = 0x30;
    abStack_1cf[4] = 0x30;
    abStack_1cf[5] = 0x30;
    abStack_1cf[6] = 0x30;
LAB_004ce0da:
    archive_set_error(&a->archive,0x22,"Numeric user ID too large");
    iVar24 = -0x19;
  }
  else {
    uVar23 = 7;
    puVar7 = (undefined4 *)auStack_1c6;
    do {
      puVar20 = puVar7;
      uVar18 = uVar17;
      *(byte *)((long)puVar20 + -1) = (byte)uVar18 & 7 | 0x30;
      uVar23 = uVar23 - 1;
      uVar17 = uVar18 >> 3;
      puVar7 = (undefined4 *)((long)puVar20 + -1);
    } while (1 < uVar23);
    if (7 < uVar18) {
      *(undefined2 *)((long)puVar20 + 3) = 0x3737;
      *(undefined4 *)((long)puVar20 + -1) = 0x37373737;
      goto LAB_004ce0da;
    }
  }
  uVar17 = archive_entry_gid(entry);
  if ((long)uVar17 < 0) {
    local_1c0 = 0x3030;
    auStack_1c6._2_4_ = 0x30303030;
LAB_004ce157:
    archive_set_error(&a->archive,0x22,"Numeric group ID too large");
    iVar24 = -0x19;
  }
  else {
    uVar23 = 7;
    puVar7 = (undefined4 *)auStack_1be;
    do {
      puVar20 = puVar7;
      uVar18 = uVar17;
      *(byte *)((long)puVar20 + -1) = (byte)uVar18 & 7 | 0x30;
      uVar23 = uVar23 - 1;
      uVar17 = uVar18 >> 3;
      puVar7 = (undefined4 *)((long)puVar20 + -1);
    } while (1 < uVar23);
    if (7 < uVar18) {
      *(undefined2 *)((long)puVar20 + 3) = 0x3737;
      *(undefined4 *)((long)puVar20 + -1) = 0x37373737;
      goto LAB_004ce157;
    }
  }
  uVar17 = archive_entry_size(entry);
  if ((long)uVar17 < 0) {
    auStack_1be._2_7_ = 0x30303030303030;
    uStack_1b5 = 0x30303030;
LAB_004ce1e4:
    archive_set_error(&a->archive,0x22,"File size out of range");
    iVar24 = -0x19;
  }
  else {
    uVar23 = 0xc;
    puVar8 = &uStack_1b1;
    do {
      puVar22 = puVar8;
      uVar18 = uVar17;
      *(byte *)((long)puVar22 + -1) = (byte)uVar18 & 7 | 0x30;
      uVar23 = uVar23 - 1;
      uVar17 = uVar18 >> 3;
      puVar8 = (undefined8 *)((long)puVar22 + -1);
    } while (1 < uVar23);
    if (7 < uVar18) {
      *(undefined8 *)((long)puVar22 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar22 + 6) = 0x37373737;
      goto LAB_004ce1e4;
    }
  }
  uVar17 = archive_entry_mtime(entry);
  if ((long)uVar17 < 0) {
    uStack_1b1._1_7_ = 0x30303030303030;
    uStack_1a9 = 0x30303030;
LAB_004ce271:
    archive_set_error(&a->archive,0x22,"File modification time too large");
    iVar24 = -0x19;
  }
  else {
    uVar23 = 0xc;
    puVar8 = (undefined8 *)auStack_1a5;
    do {
      puVar22 = puVar8;
      uVar18 = uVar17;
      *(byte *)((long)puVar22 + -1) = (byte)uVar18 & 7 | 0x30;
      uVar23 = uVar23 - 1;
      uVar17 = uVar18 >> 3;
      puVar8 = (undefined8 *)((long)puVar22 + -1);
    } while (1 < uVar23);
    if (7 < uVar18) {
      *(undefined8 *)((long)puVar22 + -1) = 0x3737373737373737;
      *(undefined4 *)((long)puVar22 + 6) = 0x37373737;
      goto LAB_004ce271;
    }
  }
  if (sVar6 != 0) {
    local_19c = uVar25;
    goto switchD_004ce39a_caseD_3;
  }
  mVar10 = archive_entry_filetype(entry);
  switch(mVar10 << 0x14 | mVar10 - 0x1000 >> 0xc) {
  case 0:
    pcVar12 = "tar format cannot archive fifo";
    break;
  case 1:
    pcVar12 = "tar format cannot archive character device";
    break;
  default:
    mVar10 = archive_entry_mode(entry);
    archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)",(ulong)mVar10);
    iVar24 = -0x19;
  case 3:
  case 7:
switchD_004ce39a_caseD_3:
    lVar19 = 0;
    iVar27 = 0;
    iVar28 = 0;
    iVar29 = 0;
    iVar30 = 0;
    do {
      uVar1 = *(undefined4 *)((long)&local_238[0].s + lVar19);
      uVar17 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
      auVar2._8_4_ = 0;
      auVar2._0_8_ = uVar17;
      auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
      auVar3[8] = (char)((uint)uVar1 >> 0x10);
      auVar3._0_8_ = uVar17;
      auVar3[9] = 0;
      auVar3._10_3_ = auVar2._10_3_;
      auVar5._5_8_ = 0;
      auVar5._0_5_ = auVar3._8_5_;
      auVar4[4] = (char)((uint)uVar1 >> 8);
      auVar4._0_4_ = (int)uVar17;
      auVar4[5] = 0;
      auVar4._6_7_ = SUB137(auVar5 << 0x40,6);
      iVar27 = iVar27 + (int)uVar17;
      iVar28 = iVar28 + auVar4._4_4_;
      iVar29 = iVar29 + auVar3._8_4_;
      iVar30 = iVar30 + (uint)(uint3)(auVar2._10_3_ >> 0x10);
      lVar19 = lVar19 + 4;
    } while (lVar19 != 0x200);
    uVar23 = 7;
    puVar7 = (undefined4 *)(auStack_1a5 + 7);
    uVar17 = (ulong)(uint)(iVar30 + iVar28 + iVar29 + iVar27);
    do {
      uVar18 = uVar17;
      puVar20 = puVar7;
      *(byte *)((long)puVar20 + -1) = (byte)uVar18 & 7 | 0x30;
      uVar23 = uVar23 - 1;
      puVar7 = (undefined4 *)((long)puVar20 + -1);
      uVar17 = uVar18 >> 3;
    } while (1 < uVar23);
    if (7 < uVar18) {
      *(undefined2 *)((long)puVar20 + 3) = 0x3737;
      *(undefined4 *)((long)puVar20 + -1) = 0x37373737;
    }
    auStack_1a5[7] = 0;
    if (-0x15 < iVar24) {
      iVar27 = __archive_write_output(a,local_238,0x200);
      if (-0x15 < iVar27) {
        if (iVar24 <= iVar27) {
          iVar27 = iVar24;
        }
        lVar21 = archive_entry_size(entry);
        *local_250 = lVar21;
        local_250[1] = (ulong)(-(int)lVar21 & 0x1ff);
        return iVar27;
      }
      return iVar27;
    }
    return iVar24;
  case 5:
    pcVar12 = "tar format cannot archive block device";
    break;
  case 9:
    local_19c = 0x32;
    goto switchD_004ce39a_caseD_3;
  case 0xb:
    pcVar12 = "tar format cannot archive socket";
  }
  iVar24 = 0x54;
LAB_004cde4f:
  archive_set_error(&a->archive,iVar24,pcVar12);
  return -0x19;
}

Assistant:

static int
archive_write_v7tar_header(struct archive_write *a, struct archive_entry *entry)
{
	char buff[512];
	int ret, ret2;
	struct v7tar *v7tar;
	struct archive_entry *entry_main;
	struct archive_string_conv *sconv;

	v7tar = (struct v7tar *)a->format_data;

	/* Setup default string conversion. */
	if (v7tar->opt_sconv == NULL) {
		if (!v7tar->init_default_conversion) {
			v7tar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			v7tar->init_default_conversion = 1;
		}
		sconv = v7tar->sconv_default;
	} else
		sconv = v7tar->opt_sconv;

	/* Sanity check. */
	if (archive_entry_pathname(entry) == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Can't record entry in tar file without pathname");
		return (ARCHIVE_FAILED);
	}

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate v7tar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pathname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate v7tar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	ret = format_header_v7tar(a, buff, entry, 1, sconv);
	if (ret < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret);
	}
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		if (entry_main)
			archive_entry_free(entry_main);
		return (ret2);
	}
	if (ret2 < ret)
		ret = ret2;

	v7tar->entry_bytes_remaining = archive_entry_size(entry);
	v7tar->entry_padding = 0x1ff & (-(int64_t)v7tar->entry_bytes_remaining);
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}